

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_char,_3U> * __thiscall
ImageT<unsigned_char,3u>::copyTo<ImageT<unsigned_char,1u>>
          (ImageT<unsigned_char,3u> *this,ImageT<unsigned_char,_1U> *dst,string_view swizzle)

{
  undefined8 uVar1;
  Color *pCVar2;
  Color CVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar4 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar5 = (*(dst->super_Image)._vptr_Image[6])(dst);
  if (iVar4 != iVar5) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 3>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 3, DstImage = ImageT<unsigned char, 1>]"
                 );
  }
  if ((*(uint32_t *)(this + 8) != (dst->super_Image).width) ||
     (*(uint32_t *)(this + 0xc) != (dst->super_Image).height)) {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 3>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 3, DstImage = ImageT<unsigned char, 1>]"
                 );
  }
  uVar1 = *(undefined8 *)(this + 0x10);
  (dst->super_Image).transferFunction = (int)uVar1;
  (dst->super_Image).primaries = (int)((ulong)uVar1 >> 0x20);
  if (*(int *)(this + 0xc) * *(int *)(this + 8) != 0) {
    uVar7 = 0;
    do {
      iVar4 = (*(dst->super_Image)._vptr_Image[5])(dst);
      uVar9 = 0;
      if (iVar4 != 0) {
        uVar9 = 0;
        do {
          uVar6 = (**(code **)(*(long *)this + 0x28))(this);
          if (uVar6 <= uVar9) break;
          pCVar2 = dst->pixels;
          CVar3.field_0 =
               (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
               ImageT<unsigned_char,_3U>::swizzlePixel
                         ((ImageT<unsigned_char,_3U> *)this,
                          (Color *)(*(long *)(this + 0x18) + uVar7 * 3),swizzle._M_str[uVar9]);
          pCVar2[uVar7].field_0 = CVar3.field_0;
          uVar9 = uVar9 + 1;
          uVar6 = (*(dst->super_Image)._vptr_Image[5])(dst);
        } while (uVar9 < uVar6);
      }
      while( true ) {
        uVar6 = (*(dst->super_Image)._vptr_Image[5])(dst);
        uVar8 = (uint)uVar9;
        if (uVar6 <= uVar8) break;
        dst->pixels[uVar7].field_0 =
             (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)((uVar8 < 3) + -1);
        uVar9 = (ulong)(uVar8 + 1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (uint)(*(int *)(this + 0xc) * *(int *)(this + 8)));
  }
  return (ImageT<unsigned_char,_3U> *)this;
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }